

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O1

void Abc_NtkSetMvVarValues(Abc_Obj_t *pObj,int nValues)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int *piVar4;
  void *pvVar5;
  int *piVar6;
  int iVar7;
  Mem_Flex_t *p;
  
  if (nValues < 2) {
    __assert_fail("nValues > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBlifMv.c"
                  ,0x5f,"void Abc_NtkSetMvVarValues(Abc_Obj_t *, int)");
  }
  if ((nValues == 2) || (pvVar5 = Abc_ObjMvVar(pObj), pvVar5 != (void *)0x0)) {
    return;
  }
  pVVar3 = pObj->pNtk->vAttrs;
  if (0xc < pVVar3->nSize) {
    pvVar5 = pVVar3->pArray[0xc];
    if (pvVar5 == (void *)0x0) {
      p = (Mem_Flex_t *)0x0;
    }
    else {
      p = *(Mem_Flex_t **)((long)pvVar5 + 0x10);
    }
    piVar6 = (int *)Mem_FlexEntryFetch(p,0x10);
    *piVar6 = nValues;
    piVar6[2] = 0;
    piVar6[3] = 0;
    pVVar3 = pObj->pNtk->vAttrs;
    if (0xc < pVVar3->nSize) {
      piVar4 = (int *)pVVar3->pArray[0xc];
      if (*(void **)(piVar4 + 2) == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecAtt.h"
                      ,0xe5,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
      }
      if (*(long *)(piVar4 + 8) == 0) {
        iVar1 = pObj->Id;
        iVar2 = *piVar4;
        if (iVar2 <= iVar1) {
          iVar7 = iVar1 + 10;
          if (iVar1 < iVar2 * 2) {
            iVar7 = iVar2 * 2;
          }
          if (iVar2 < iVar7) {
            pvVar5 = realloc(*(void **)(piVar4 + 2),(long)iVar7 * 8);
            *(void **)(piVar4 + 2) = pvVar5;
            memset((void *)((long)pvVar5 + (long)*piVar4 * 8),0,((long)iVar7 - (long)*piVar4) * 8);
            *piVar4 = iVar7;
          }
        }
        *(int **)(*(long *)(piVar4 + 2) + (long)iVar1 * 8) = piVar6;
        return;
      }
      __assert_fail("p->pFuncStartObj == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecAtt.h"
                    ,0xe6,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NtkSetMvVarValues( Abc_Obj_t * pObj, int nValues )
{
    Mem_Flex_t * pFlex;
    struct temp 
    { 
        int nValues; 
        char ** pNames; 
    } * pVarStruct;
    assert( nValues > 1 );
    // skip binary signals
    if ( nValues == 2 )
        return;
    // skip already assigned signals
    if ( Abc_ObjMvVar(pObj) != NULL )
        return;
    // create the structure
    pFlex = (Mem_Flex_t *)Abc_NtkMvVarMan( pObj->pNtk );
    pVarStruct = (struct temp *)Mem_FlexEntryFetch( pFlex, sizeof(struct temp) );
    pVarStruct->nValues = nValues;
    pVarStruct->pNames = NULL;
    Abc_ObjSetMvVar( pObj, pVarStruct );
}